

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CardGroup.cpp
# Opt level: O3

CardGroup * __thiscall CardGroup::last(CardGroup *__return_storage_ptr__,CardGroup *this,int n)

{
  Card *card;
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  
  CardGroup(__return_storage_ptr__);
  if (0 < n) {
    uVar2 = (ulong)((long)(this->cards).super__Vector_base<Card_*,_std::allocator<Card_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->cards).super__Vector_base<Card_*,_std::allocator<Card_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
    if ((this->top < (int)uVar2) && (-1 < (int)uVar2)) {
      while (bVar3 = n != 0, n = n + -1, bVar3) {
        while( true ) {
          card = (this->cards).super__Vector_base<Card_*,_std::allocator<Card_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar2 & 0xffffffff];
          if (card != (Card *)0x0) break;
          if ((int)uVar2 < 1) {
            return __return_storage_ptr__;
          }
          uVar1 = (int)uVar2 - 1;
          uVar2 = (ulong)uVar1;
          if ((int)uVar1 <= this->top) {
            return __return_storage_ptr__;
          }
        }
        add(__return_storage_ptr__,card);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CardGroup CardGroup::last(int n) const {
        CardGroup g;
        int pos = this->cards.size();
        if(top >= pos || pos < 0 || n <=0) return g;
        while(n--) {
                while(this->cards[pos] == NULL) {
                        pos--;
                        if(top >= pos || pos < 0) return g;
                }
                g.add(this->cards[pos]);
        }
        return g;
}